

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionArgumentInfo
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  Op OVar4;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_960;
  DiagnosticStream local_788;
  DiagnosticStream local_5b0;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  size_type local_28;
  size_type num_operands;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  num_operands = (size_type)inst;
  inst_local = (Instruction *)_;
  this = Instruction::operands(inst);
  local_28 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
  pIVar1 = inst_local;
  uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,4);
  OVar4 = ValidationState_t::GetIdOpcode((ValidationState_t *)pIVar1,uVar3);
  pIVar1 = inst_local;
  if (OVar4 == OpString) {
    if (5 < local_28) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,5);
      OVar4 = ValidationState_t::GetIdOpcode((ValidationState_t *)pIVar1,uVar3);
      if (OVar4 != OpString) {
        ValidationState_t::diag
                  (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_3d8,(char (*) [29])"TypeName must be an OpString");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_3d8);
        return __local._4_4_;
      }
    }
    pIVar1 = inst_local;
    if (6 < local_28) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,6);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      if (!bVar2) {
        ValidationState_t::diag
                  (&local_5b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_5b0,
                            (char (*) [62])
                            "AddressQualifier must be a 32-bit unsigned integer OpConstant");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_5b0);
        return __local._4_4_;
      }
    }
    pIVar1 = inst_local;
    if (7 < local_28) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,7);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      if (!bVar2) {
        ValidationState_t::diag
                  (&local_788,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_788,
                            (char (*) [61])
                            "AccessQualifier must be a 32-bit unsigned integer OpConstant");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_788);
        return __local._4_4_;
      }
    }
    pIVar1 = inst_local;
    if (8 < local_28) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,8);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      if (!bVar2) {
        ValidationState_t::diag
                  (&local_960,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_960,
                            (char (*) [59])
                            "TypeQualifier must be a 32-bit unsigned integer OpConstant");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_960);
        return __local._4_4_;
      }
    }
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)num_operands);
    pDVar5 = DiagnosticStream::operator<<(&local_200,(char (*) [25])0x63b417);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionArgumentInfo(ValidationState_t& _,
                                                 const Instruction* inst) {
  const auto num_operands = inst->operands().size();
  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(4)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }
  if (num_operands > 5) {
    if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(5)) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeName must be an OpString";
    }
  }
  if (num_operands > 6) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AddressQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 7) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AccessQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 8) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(8))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }

  return SPV_SUCCESS;
}